

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

domain_type * __thiscall cs::domain_type::add_var(domain_type *this,var_id *id,var *val)

{
  string *key;
  size_t sVar1;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_unsigned_long>_>
  puVar2;
  unsigned_long local_50;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>::iterator,_bool>
  local_48;
  
  key = &id->m_id;
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)this,key);
  if (sVar1 == 0) {
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back(&this->m_slot,val);
    local_50 = ((long)(this->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::
    emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_0>
              (&local_48,
               (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)this,key,&local_50);
    id->m_slot_id =
         ((long)(this->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
    std::__shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(id->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>,
               &(this->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    if ((id->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (this->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      puVar2 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
               ::
               operator[]<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                           *)this,key);
      id->m_slot_id = *puVar2;
      std::__shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(id->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>);
    }
    cs_impl::any::operator=
              ((this->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
               _M_impl.super__Vector_impl_data._M_start + id->m_slot_id,val);
  }
  return this;
}

Assistant:

domain_type &add_var(const var_id &id, const var &val)
		{
			if (m_reflect.count(id.m_id) == 0) {
				m_slot.push_back(val);
				m_reflect.emplace(id.m_id, m_slot.size() - 1);
				id.m_slot_id = m_slot.size() - 1;
				id.m_ref = m_ref;
			}
			else {
				if (id.m_ref != m_ref) {
					id.m_slot_id = m_reflect[id.m_id];
					id.m_ref = m_ref;
				}
				m_slot[id.m_slot_id] = val;
			}
			return *this;
		}